

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

void __thiscall
GdlSlotRefExpression::GenerateEngineCode
          (GdlSlotRefExpression *this,uint32_t param_1,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int iritCurrent,
          vector<int,_std::allocator<int>_> *pviritInput,int param_5,bool param_6,int param_7,
          int *pnValue)

{
  pointer *ppuVar1;
  iterator iVar2;
  int iVar3;
  sdata8 offset8;
  uchar local_a [2];
  
  iVar3 = this->m_nIOIndex;
  if (pviritInput != (vector<int,_std::allocator<int>_> *)0x0) {
    iVar3 = (pviritInput->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar3];
  }
  local_a[0] = (uchar)(iVar3 - iritCurrent);
  *pnValue = iVar3 - iritCurrent;
  local_a[1] = 1;
  iVar2._M_current =
       (vbOutput->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (vbOutput->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (vbOutput,iVar2,local_a + 1);
  }
  else {
    *iVar2._M_current = '\x01';
    ppuVar1 = &(vbOutput->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar2._M_current =
       (vbOutput->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (vbOutput->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)vbOutput,iVar2,local_a);
  }
  else {
    *iVar2._M_current = local_a[0];
    ppuVar1 = &(vbOutput->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void GdlSlotRefExpression::GenerateEngineCode(uint32_t /*fxdRuleVersion*/, std::vector<gr::byte> & vbOutput,
	int iritCurrent, std::vector<int> * pviritInput, int /*nIIndex*/,
	bool /*fAttachAt*/, int /*iritAttachTo*/, int * pnValue)
{
	int nOffset = m_nIOIndex - iritCurrent;

	Assert(!pviritInput);	// should not be used for constraints
	if (pviritInput)
		nOffset = (*pviritInput)[m_nIOIndex] - iritCurrent;

	Assert(-128 <= nOffset && nOffset < 128); // Check this fits in 8 bits.
	gr::sdata8 const offset8 = nOffset;
	//	If this happens to be the value of an attach.to attribute, current or following
	//	slot needs to have insert = false set.
	*pnValue = nOffset;

	vbOutput.push_back(kopPushByte);
	vbOutput.push_back(reinterpret_cast<gr::byte const &>(offset8));
}